

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall jsonnet::internal::FixNewlines::expand(FixNewlines *this,ObjectComprehension *comp)

{
  pointer pOVar1;
  pointer pCVar2;
  Fodder *fodder;
  ObjectField *field;
  pointer pOVar3;
  pointer pCVar4;
  
  pOVar1 = (comp->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar3 = (comp->fields).
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar3 != pOVar1; pOVar3 = pOVar3 + 1) {
    fodder = &pOVar3->fodder1;
    if (pOVar3->kind == FIELD_STR) {
      fodder = &pOVar3->expr1->openFodder;
    }
    ensureCleanNewline(fodder);
  }
  pCVar2 = (comp->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar4 = (comp->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar4 != pCVar2; pCVar4 = pCVar4 + 1) {
    ensureCleanNewline(&pCVar4->openFodder);
  }
  ensureCleanNewline(&comp->closeFodder);
  return;
}

Assistant:

void expand(ObjectComprehension *comp)
    {
        for (auto &field : comp->fields) {
            ensureCleanNewline(objectFieldOpenFodder(field));
        }
        for (auto &spec : comp->specs) {
            ensureCleanNewline(spec.openFodder);
        }
        ensureCleanNewline(comp->closeFodder);
    }